

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

PHYSFS_sint64 PHYSFS_fileLength(PHYSFS_File *handle)

{
  PHYSFS_sint64 in_RAX;
  PHYSFS_sint64 retval;
  PHYSFS_sint64 local_8;
  
  if (handle->opaque == (void *)0x0) {
    local_8 = in_RAX;
    if ((magicStream != (FileHandle *)0x0) && (magicStream->forReading != '\0')) {
      PHYSFS_readBytes((PHYSFS_File *)magicStream,&local_8,8);
    }
  }
  else {
    local_8 = (**(code **)((long)handle->opaque + 0x30))();
  }
  if ((magicStream != (FileHandle *)0x0) && (magicStream->forReading == '\0')) {
    PHYSFS_writeBytes((PHYSFS_File *)magicStream,&local_8,8);
  }
  return local_8;
}

Assistant:

PHYSFS_sint64 PHYSFS_fileLength(PHYSFS_File *handle)
{
    PHYSFS_sint64 retval;
    PHYSFS_Io *io = ((FileHandle *) handle)->io;
    if (io == NULL)
    {
        if (magicStream && magicStream->forReading)
            PHYSFS_readBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));
    } /* if */
    else
    {
        retval = io->length(io);
    } /* else */

    if (magicStream && !magicStream->forReading)
        PHYSFS_writeBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));

    return retval;
}